

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  uint *puVar1;
  Instruction *pc;
  int nresults_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  if (e->k == VCALL) {
    fs->f->code[(e->u).info] =
         fs->f->code[(e->u).info] & 0xff803fff | (nresults + 1U & 0x1ff) << 0xe;
  }
  else if (e->k == VVARARG) {
    puVar1 = fs->f->code + (e->u).info;
    *puVar1 = *puVar1 & 0x7fffff | (nresults + 1) * 0x800000;
    *puVar1 = *puVar1 & 0xffffc03f | (uint)fs->freereg << 6;
    luaK_reserveregs(fs,1);
  }
  return;
}

Assistant:

void luaK_setreturns(FuncState *fs, expdesc *e, int nresults) {
    if (e->k == VCALL) {  /* expression is an open function call? */
        SETARG_C(getinstruction(fs, e), nresults + 1);
    } else if (e->k == VVARARG) {
        Instruction *pc = &getinstruction(fs, e);
        SETARG_B(*pc, nresults + 1);
        SETARG_A(*pc, fs->freereg);
        luaK_reserveregs(fs, 1);
    } else
        lua_assert(nresults == LUA_MULTRET);
}